

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

char * getEGLErrorString(EGLint error)

{
  EGLint error_local;
  char *local_8;
  
  switch(error) {
  case 0x3000:
    local_8 = "Success";
    break;
  case 0x3001:
    local_8 = "EGL is not or could not be initialized";
    break;
  case 0x3002:
    local_8 = "EGL cannot access a requested resource";
    break;
  case 0x3003:
    local_8 = "EGL failed to allocate resources for the requested operation";
    break;
  case 0x3004:
    local_8 = "An unrecognized attribute or attribute value was passed in the attribute list";
    break;
  case 0x3005:
    local_8 = "An EGLConfig argument does not name a valid EGL frame buffer configuration";
    break;
  case 0x3006:
    local_8 = "An EGLContext argument does not name a valid EGL rendering context";
    break;
  case 0x3007:
    local_8 = 
    "The current surface of the calling thread is a window, pixel buffer or pixmap that is no longer valid"
    ;
    break;
  case 0x3008:
    local_8 = "An EGLDisplay argument does not name a valid EGL display connection";
    break;
  case 0x3009:
    local_8 = "Arguments are inconsistent";
    break;
  case 0x300a:
    local_8 = "A NativePixmapType argument does not refer to a valid native pixmap";
    break;
  case 0x300b:
    local_8 = "A NativeWindowType argument does not refer to a valid native window";
    break;
  case 0x300c:
    local_8 = "One or more argument values are invalid";
    break;
  case 0x300d:
    local_8 = "An EGLSurface argument does not name a valid surface configured for GL rendering";
    break;
  case 0x300e:
    local_8 = "The application must destroy all contexts and reinitialise";
    break;
  default:
    local_8 = "ERROR: UNKNOWN EGL ERROR";
  }
  return local_8;
}

Assistant:

static const char* getEGLErrorString(EGLint error)
{
    switch (error)
    {
        case EGL_SUCCESS:
            return "Success";
        case EGL_NOT_INITIALIZED:
            return "EGL is not or could not be initialized";
        case EGL_BAD_ACCESS:
            return "EGL cannot access a requested resource";
        case EGL_BAD_ALLOC:
            return "EGL failed to allocate resources for the requested operation";
        case EGL_BAD_ATTRIBUTE:
            return "An unrecognized attribute or attribute value was passed in the attribute list";
        case EGL_BAD_CONTEXT:
            return "An EGLContext argument does not name a valid EGL rendering context";
        case EGL_BAD_CONFIG:
            return "An EGLConfig argument does not name a valid EGL frame buffer configuration";
        case EGL_BAD_CURRENT_SURFACE:
            return "The current surface of the calling thread is a window, pixel buffer or pixmap that is no longer valid";
        case EGL_BAD_DISPLAY:
            return "An EGLDisplay argument does not name a valid EGL display connection";
        case EGL_BAD_SURFACE:
            return "An EGLSurface argument does not name a valid surface configured for GL rendering";
        case EGL_BAD_MATCH:
            return "Arguments are inconsistent";
        case EGL_BAD_PARAMETER:
            return "One or more argument values are invalid";
        case EGL_BAD_NATIVE_PIXMAP:
            return "A NativePixmapType argument does not refer to a valid native pixmap";
        case EGL_BAD_NATIVE_WINDOW:
            return "A NativeWindowType argument does not refer to a valid native window";
        case EGL_CONTEXT_LOST:
            return "The application must destroy all contexts and reinitialise";
        default:
            return "ERROR: UNKNOWN EGL ERROR";
    }
}